

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

Stream * rw::d3d8::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  void **ppvVar2;
  uint val;
  int32 iVar3;
  undefined2 *puVar4;
  uint16 *puVar5;
  uint8 *puVar6;
  uint8 *verts;
  uint16 *indices;
  uint32 i_1;
  int32 matid;
  uint32 i;
  InstanceData *inst;
  uint8 *p;
  uint8 *data;
  int32 size;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 8)) {
    Stream::writeU32(stream,8);
    lVar1 = *(long *)((long)object + 0x98);
    val = (uint)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x2c + 4;
    puVar4 = (undefined2 *)
             mustmalloc_LOC((long)(int)val,0x1000f,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 181"
                           );
    Stream::writeI32(stream,val);
    *puVar4 = *(undefined2 *)(lVar1 + 4);
    puVar4[1] = *(undefined2 *)(lVar1 + 6);
    inst = (InstanceData *)(puVar4 + 2);
    _matid = *(uint32 **)(lVar1 + 8);
    for (i_1 = 0; i_1 < *(ushort *)(lVar1 + 6); i_1 = i_1 + 1) {
      inst->minVert = *_matid;
      inst->stride = _matid[1];
      inst->numVertices = _matid[2];
      inst->numIndices = _matid[3];
      iVar3 = MaterialList::findIndex
                        ((MaterialList *)((long)object + 0x80),*(Material **)(_matid + 4));
      *(int32 *)&inst->material = iVar3;
      *(uint32 *)((long)&inst->material + 4) = _matid[6];
      inst->vertexShader = _matid[7];
      inst->primType = 0;
      *(undefined4 *)&inst->indexBuffer = 0;
      *(uint32 *)((long)&inst->indexBuffer + 4) = _matid[0xc];
      *(char *)&inst->vertexBuffer = (char)_matid[0xd];
      ppvVar2 = &inst->vertexBuffer;
      *(undefined1 *)((long)&inst->vertexBuffer + 1) = *(undefined1 *)((long)_matid + 0x35);
      inst = (InstanceData *)((long)&inst->vertexBuffer + 3);
      *(undefined1 *)((long)ppvVar2 + 2) = *(undefined1 *)((long)_matid + 0x36);
      _matid = _matid + 0xe;
    }
    (*stream->_vptr_Stream[3])(stream,puVar4,(ulong)val);
    (*DAT_001660a8)(puVar4);
    _matid = *(uint32 **)(lVar1 + 8);
    for (indices._4_4_ = 0; indices._4_4_ < *(ushort *)(lVar1 + 6);
        indices._4_4_ = indices._4_4_ + 1) {
      puVar5 = d3d::lockIndices(*(void **)((long)_matid + 0x20),0,0,0);
      (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)(uint)(*(int *)((long)_matid + 0xc) << 1));
      d3d::unlockIndices(*(void **)((long)_matid + 0x20));
      puVar6 = d3d::lockVertices(*(void **)((long)_matid + 0x28),0,0,0);
      (*stream->_vptr_Stream[3])
                (stream,puVar6,
                 (ulong)(uint)(*(int *)((long)_matid + 4) * *(int *)((long)_matid + 8)));
      d3d::unlockVertices(*(void **)((long)_matid + 0x28));
      _matid = (uint32 *)((long)_matid + 0x38);
    }
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return stream;
	stream->writeU32(PLATFORM_D3D8);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;

	int32 size = 4 + geometry->meshHeader->numMeshes*0x2C;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);
	uint8 *p = data;
	*(uint16*)p = header->serialNumber; p += 2;
	*(uint16*)p = header->numMeshes; p += 2;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->minVert; p += 4;
		*(uint32*)p = inst->stride; p += 4;
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->numIndices; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(uint32*)p = inst->vertexShader; p += 4;
		*(uint32*)p = inst->primType; p += 4;
		*(uint32*)p = 0; p += 4;		// index buffer
		*(uint32*)p = 0; p += 4;		// vertex buffer
		*(uint32*)p = inst->baseIndex; p += 4;
		*p++ = inst->vertexAlpha;
		*p++ = inst->managed;
		*p++ = inst->remapped;
		inst++;
	}
	stream->write8(data, size);
	rwFree(data);

	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		stream->write8(indices, 2*inst->numIndices);
		unlockIndices(inst->indexBuffer);

		uint8 *verts = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, inst->stride*inst->numVertices);
		unlockVertices(inst->vertexBuffer);
		inst++;
	}
	return stream;
}